

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  short sVar4;
  bool bVar5;
  short sVar6;
  short sVar7;
  bool bVar8;
  short sVar9;
  bool bVar10;
  short sVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined2 uVar14;
  short sVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  parasail_result_t *ppVar20;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  int16_t *ptr_03;
  int16_t *ptr_04;
  int16_t *ptr_05;
  int16_t *ptr_06;
  int16_t *ptr_07;
  int16_t *ptr_08;
  long lVar21;
  short sVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  short sVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  short sVar36;
  int16_t iVar37;
  uint uVar38;
  ulong uVar39;
  short sVar40;
  undefined4 uVar41;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  undefined1 auVar42 [16];
  short sVar44;
  short sVar45;
  short sVar51;
  short sVar52;
  undefined1 auVar43 [16];
  undefined1 auVar54 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  short sVar62;
  ushort uVar63;
  ushort uVar64;
  short sVar70;
  short sVar72;
  short sVar74;
  short sVar76;
  short sVar78;
  short sVar80;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ushort uVar71;
  ushort uVar73;
  ushort uVar75;
  ushort uVar77;
  ushort uVar79;
  ushort uVar81;
  short sVar82;
  ushort uVar83;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  ushort uVar84;
  undefined8 uVar85;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  undefined1 auVar86 [16];
  ushort uVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  short sVar99;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  undefined1 auVar100 [16];
  short sVar108;
  undefined1 auVar101 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 local_328 [16];
  undefined1 local_308 [16];
  short local_2d8;
  short sStack_2d6;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  undefined1 local_1c8 [16];
  ushort local_1b8;
  ushort uStack_1b6;
  ushort uStack_1b4;
  ushort uStack_1b2;
  ushort uStack_1b0;
  ushort uStack_1ae;
  ushort uStack_1ac;
  ushort uStack_1aa;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 uStack_170;
  int *local_168;
  ulong local_160;
  ulong local_158;
  int *local_150;
  int *local_148;
  int *local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [4];
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  short sVar53;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_stats_diag_sse41_128_16_cold_8();
    return (parasail_result_t *)0x0;
  }
  uVar39 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sw_stats_diag_sse41_128_16_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sw_stats_diag_sse41_128_16_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sw_stats_diag_sse41_128_16_cold_5();
    return (parasail_result_t *)0x0;
  }
  uVar30 = (ulong)(uint)_s1Len;
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_stats_diag_sse41_128_16_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_sw_stats_diag_sse41_128_16_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_sw_stats_diag_sse41_128_16_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sw_stats_diag_sse41_128_16_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_006a004d;
  }
  uVar30 = (ulong)(uint)matrix->length;
LAB_006a004d:
  iVar16 = -open;
  iVar33 = matrix->min;
  iVar23 = -iVar33;
  if (iVar33 != iVar16 && SBORROW4(iVar33,iVar16) == iVar33 + open < 0) {
    iVar23 = open;
  }
  uVar27 = iVar23 - 0x7fff;
  iVar33 = matrix->max;
  auVar42 = pshuflw(ZEXT416(uVar27),ZEXT416(uVar27),0);
  uVar41 = auVar42._0_4_;
  local_178 = CONCAT44(uVar41,uVar41);
  uStack_170 = CONCAT44(uVar41,uVar41);
  local_1e8._4_4_ = uVar41;
  local_1e8._0_4_ = uVar41;
  local_1e8._8_4_ = uVar41;
  local_1e8._12_4_ = uVar41;
  local_1f8._4_4_ = uVar41;
  local_1f8._0_4_ = uVar41;
  local_1f8._8_4_ = uVar41;
  local_1f8._12_4_ = uVar41;
  local_208._4_4_ = uVar41;
  local_208._0_4_ = uVar41;
  local_208._8_4_ = uVar41;
  local_208._12_4_ = uVar41;
  local_218._4_4_ = uVar41;
  local_218._0_4_ = uVar41;
  local_218._8_4_ = uVar41;
  local_218._12_4_ = uVar41;
  local_2d8 = auVar42._0_2_;
  sStack_2d6 = auVar42._2_2_;
  local_228 = CONCAT44(uVar41,uVar41);
  uStack_220 = CONCAT44(uVar41,uVar41);
  ppVar20 = parasail_result_new_stats();
  if (ppVar20 != (parasail_result_t *)0x0) {
    uVar38 = (uint)uVar30;
    iVar23 = uVar38 + 7;
    ppVar20->flag = ppVar20->flag | 0x8211004;
    ptr = parasail_memalign_int16_t(0x10,(long)iVar23);
    uVar29 = (ulong)(s2Len + 0xe);
    ptr_00 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_01 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_02 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_03 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_04 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_05 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_06 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_07 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_08 = parasail_memalign_int16_t(0x10,uVar29);
    auVar67._0_8_ = -(ulong)(ptr == (int16_t *)0x0);
    auVar67._8_8_ = -(ulong)(ptr_00 == (int16_t *)0x0);
    auVar65._0_8_ = -(ulong)(ptr_01 == (int16_t *)0x0);
    auVar65._8_8_ = -(ulong)(ptr_02 == (int16_t *)0x0);
    auVar65 = packssdw(auVar67,auVar65);
    auVar66._0_8_ = -(ulong)(ptr_03 == (int16_t *)0x0);
    auVar66._8_8_ = -(ulong)(ptr_04 == (int16_t *)0x0);
    auVar42._0_8_ = -(ulong)(ptr_05 == (int16_t *)0x0);
    auVar42._8_8_ = -(ulong)(ptr_06 == (int16_t *)0x0);
    auVar42 = packssdw(auVar66,auVar42);
    auVar66 = packssdw(auVar65,auVar42);
    if ((ptr_08 != (int16_t *)0x0 && ptr_07 != (int16_t *)0x0) &&
        ((((((((((((((((auVar66 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar66 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar66 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar66 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar66 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar66 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar66 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar66 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar66 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar66 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar66 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar66 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar66[0xf]))
    {
      auVar66 = pshuflw(auVar42,ZEXT416(CONCAT22((short)((uint)iVar16 >> 0x10),
                                                 0x7ffe - (short)iVar33)),0);
      auVar42 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
      auVar65 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
      auVar67 = pshuflw(ZEXT416(uVar38),ZEXT416(uVar38),0);
      auVar86 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
      if (0 < (int)uVar38) {
        piVar1 = matrix->mapper;
        uVar29 = 0;
        do {
          ptr[uVar29] = (int16_t)piVar1[(byte)_s1[uVar29]];
          uVar29 = uVar29 + 1;
        } while (uVar30 != uVar29);
      }
      uVar17 = s2Len + 7;
      local_1d8 = auVar66._0_2_;
      sStack_1d6 = auVar66._2_2_;
      auVar100._4_2_ = local_2d8;
      auVar100._0_4_ = uVar41;
      auVar100._6_2_ = sStack_2d6;
      auVar100._8_2_ = local_2d8;
      auVar100._10_2_ = sStack_2d6;
      auVar100._12_2_ = local_2d8;
      auVar100._14_2_ = sStack_2d6;
      local_1c8 = pblendw((undefined1  [16])0x0,auVar100,0x7f);
      local_c8 = auVar42._0_4_;
      local_d8 = auVar65._0_4_;
      local_f8 = auVar67._0_4_;
      local_e8 = auVar86._0_4_;
      lVar21 = (long)(int)uVar38;
      iVar33 = uVar38 + 1;
      if ((int)(uVar38 + 1) < iVar23) {
        iVar33 = iVar23;
      }
      uVar30 = 0;
      sStack_1d4 = local_1d8;
      sStack_1d2 = sStack_1d6;
      sStack_1d0 = local_1d8;
      sStack_1ce = sStack_1d6;
      sStack_1cc = local_1d8;
      sStack_1ca = sStack_1d6;
      uStack_f4 = local_f8;
      uStack_f0 = local_f8;
      uStack_ec = local_f8;
      uStack_e4 = local_e8;
      uStack_e0 = local_e8;
      uStack_dc = local_e8;
      uStack_d4 = local_d8;
      uStack_d0 = local_d8;
      uStack_cc = local_d8;
      uStack_c4 = local_c8;
      uStack_c0 = local_c8;
      uStack_bc = local_c8;
      memset(ptr + lVar21,0,(ulong)(~uVar38 + iVar33) * 2 + 2);
      piVar1 = matrix->mapper;
      do {
        ptr_00[uVar30 + 7] = (int16_t)piVar1[(byte)_s2[uVar30]];
        uVar30 = uVar30 + 1;
      } while (uVar39 != uVar30);
      ptr_00[3] = 0;
      ptr_00[4] = 0;
      ptr_00[5] = 0;
      ptr_00[6] = 0;
      ptr_00[0] = 0;
      ptr_00[1] = 0;
      ptr_00[2] = 0;
      ptr_00[3] = 0;
      uVar19 = s2Len + 1U;
      if ((int)(s2Len + 1U) < (int)uVar17) {
        uVar19 = uVar17;
      }
      memset(ptr_00 + uVar39 + 7,0,(ulong)(~s2Len + uVar19) * 2 + 2);
      uVar30 = 0;
      do {
        ptr_01[uVar30 + 7] = 0;
        ptr_02[uVar30 + 7] = 0;
        ptr_03[uVar30 + 7] = 0;
        ptr_04[uVar30 + 7] = 0;
        iVar37 = (int16_t)uVar27;
        ptr_05[uVar30 + 7] = iVar37;
        ptr_06[uVar30 + 7] = 0;
        ptr_07[uVar30 + 7] = 0;
        ptr_08[uVar30 + 7] = 0;
        uVar30 = uVar30 + 1;
      } while (uVar39 != uVar30);
      lVar25 = 0;
      do {
        *(int16_t *)((long)ptr_01 + lVar25) = iVar37;
        *(undefined2 *)((long)ptr_02 + lVar25) = 0;
        *(undefined2 *)((long)ptr_03 + lVar25) = 0;
        *(undefined2 *)((long)ptr_04 + lVar25) = 0;
        *(int16_t *)((long)ptr_05 + lVar25) = iVar37;
        *(undefined2 *)((long)ptr_06 + lVar25) = 0;
        *(undefined2 *)((long)ptr_07 + lVar25) = 0;
        *(undefined2 *)((long)ptr_08 + lVar25) = 0;
        lVar25 = lVar25 + 2;
      } while (lVar25 != 0xe);
      lVar25 = 0;
      do {
        ptr_01[uVar39 + lVar25 + 7] = iVar37;
        ptr_02[uVar39 + lVar25 + 7] = 0;
        ptr_03[uVar39 + lVar25 + 7] = 0;
        ptr_04[uVar39 + lVar25 + 7] = 0;
        ptr_05[uVar39 + lVar25 + 7] = iVar37;
        ptr_06[uVar39 + lVar25 + 7] = 0;
        ptr_07[uVar39 + lVar25 + 7] = 0;
        ptr_08[uVar39 + lVar25 + 7] = 0;
        lVar25 = lVar25 + 1;
      } while (s2Len + (int)lVar25 < (int)uVar17);
      ptr_01[6] = 0;
      local_2a8._4_2_ = local_2d8;
      local_2a8._0_4_ = uVar41;
      local_2a8._6_2_ = sStack_2d6;
      local_2a8._8_2_ = local_2d8;
      local_2a8._10_2_ = sStack_2d6;
      local_2a8._12_2_ = local_2d8;
      local_2a8._14_2_ = sStack_2d6;
      local_268 = CONCAT26(sStack_1d2,CONCAT24(sStack_1d4,CONCAT22(sStack_1d6,local_1d8)));
      uStack_260 = CONCAT26(sStack_1ca,CONCAT24(sStack_1cc,CONCAT22(sStack_1ce,sStack_1d0)));
      local_2c8 = local_2a8;
      local_2b8 = local_2a8;
      local_218 = local_2a8;
      local_258 = local_2a8;
      if (0 < (int)uVar38) {
        local_168 = matrix->matrix;
        iVar33 = matrix->size;
        iVar23 = matrix->type;
        uVar38 = uVar38 - 1;
        local_158 = 1;
        if (1 < (int)uVar17) {
          local_158 = (ulong)uVar17;
        }
        local_188._8_8_ = uStack_170;
        local_188._0_8_ = local_178;
        local_198._8_8_ = uStack_220;
        local_198._0_8_ = local_228;
        local_248._8_8_ = 0x100020003;
        local_248._0_8_ = 0x4000500060007;
        uVar39 = 0;
        local_268 = CONCAT26(sStack_1d2,CONCAT24(sStack_1d4,CONCAT22(sStack_1d6,local_1d8)));
        uStack_260 = CONCAT26(sStack_1ca,CONCAT24(sStack_1cc,CONCAT22(sStack_1ce,sStack_1d0)));
        local_2c8 = local_2a8;
        local_2b8 = local_2a8;
        local_218 = local_2a8;
        local_258 = local_2a8;
        do {
          auVar42 = *(undefined1 (*) [16])(ptr + uVar39);
          local_160 = uVar39;
          if (iVar23 == 0) {
            uVar17 = (uint)auVar42._0_2_;
            uVar32 = (uint)auVar42._2_2_;
            uVar28 = (uint)auVar42._4_2_;
            uVar35 = (uint)auVar42._6_2_;
            uVar18 = (uint)auVar42._8_2_;
            uVar34 = (uint)auVar42._10_2_;
            uVar24 = (uint)auVar42._12_2_;
            uVar19 = (int)auVar42._14_2_;
          }
          else {
            uVar17 = (uint)uVar39;
            uVar32 = uVar17 | 1;
            if (lVar21 <= (long)(uVar39 | 1)) {
              uVar32 = uVar38;
            }
            uVar28 = uVar17 | 2;
            if (lVar21 <= (long)(uVar39 | 2)) {
              uVar28 = uVar38;
            }
            uVar35 = uVar17 | 3;
            if (lVar21 <= (long)(uVar39 | 3)) {
              uVar35 = uVar38;
            }
            uVar18 = uVar17 | 4;
            if (lVar21 <= (long)(uVar39 | 4)) {
              uVar18 = uVar38;
            }
            uVar34 = uVar17 | 5;
            if (lVar21 <= (long)(uVar39 | 5)) {
              uVar34 = uVar38;
            }
            uVar24 = uVar17 | 6;
            if (lVar21 <= (long)(uVar39 | 6)) {
              uVar24 = uVar38;
            }
            uVar19 = uVar17 | 7;
            if (lVar21 <= (long)(uVar39 | 7)) {
              uVar19 = uVar38;
            }
          }
          local_a8 = pshufb(auVar42,_DAT_00907360);
          local_140 = local_168 + (int)(uVar34 * iVar33);
          local_148 = local_168 + (int)(uVar35 * iVar33);
          local_150 = local_168 + (int)(uVar32 * iVar33);
          auVar114 = (undefined1  [16])0x0;
          local_b8 = -(ushort)((short)local_248._0_2_ < (short)local_f8);
          sStack_b6 = -(ushort)((short)local_248._2_2_ < local_f8._2_2_);
          sStack_b4 = -(ushort)((short)local_248._4_2_ < (short)uStack_f4);
          sStack_b2 = -(ushort)((short)local_248._6_2_ < uStack_f4._2_2_);
          sStack_b0 = -(ushort)((short)local_248._8_2_ < (short)uStack_f0);
          sStack_ae = -(ushort)((short)local_248._10_2_ < uStack_f0._2_2_);
          sStack_ac = -(ushort)((short)local_248._12_2_ < (short)uStack_ec);
          sStack_aa = -(ushort)((short)local_248._14_2_ < uStack_ec._2_2_);
          uVar31 = 0;
          auVar86._4_2_ = local_2d8;
          auVar86._0_4_ = uVar41;
          auVar86._6_2_ = sStack_2d6;
          auVar86._8_2_ = local_2d8;
          auVar86._10_2_ = sStack_2d6;
          auVar86._12_2_ = local_2d8;
          auVar86._14_2_ = sStack_2d6;
          auVar95 = (undefined1  [16])0x0;
          local_308 = (undefined1  [16])0x0;
          local_138 = (undefined1  [16])0x0;
          auVar119 = (undefined1  [16])0x0;
          auVar117 = (undefined1  [16])0x0;
          local_328 = (undefined1  [16])0x0;
          auVar111 = (undefined1  [16])0x0;
          local_118 = (undefined1  [16])0x0;
          local_78._0_8_ = 0;
          uVar29 = 0;
          uVar30 = 0;
          auVar42 = local_a8;
          auVar66 = local_1c8;
          auVar65 = local_1c8;
          auVar67 = _DAT_00904d00;
          auVar100 = (undefined1  [16])0x0;
          uVar85 = 0;
          local_128 = auVar86;
          _local_108 = auVar86;
          do {
            auVar98 = local_118;
            local_98 = auVar67;
            local_48 = local_218;
            uStack_1b0 = (ushort)uVar30;
            uStack_1ae = (ushort)(uVar30 >> 0x10);
            uStack_1ac = (ushort)(uVar30 >> 0x20);
            uStack_1aa = (ushort)(uVar30 >> 0x30);
            local_1a8._8_8_ = uVar29;
            local_1a8._0_8_ = local_78._0_8_;
            local_58._0_8_ = auVar66._2_8_;
            local_58._8_8_ = auVar66._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar31 + 7] << 0x30;
            local_68._0_8_ = auVar111._2_8_;
            uVar30 = auVar111._8_8_ >> 0x10 | (ulong)(ushort)ptr_02[uVar31 + 7] << 0x30;
            local_68._8_8_ = uVar30;
            local_78._0_8_ = local_328._2_8_;
            uVar29 = local_328._8_8_ >> 0x10 | (ulong)(ushort)ptr_03[uVar31 + 7] << 0x30;
            local_78._8_8_ = uVar29;
            auVar94._0_8_ = auVar86._2_8_;
            auVar94._8_8_ = auVar86._8_8_ >> 0x10 | (ulong)(ushort)ptr_05[uVar31 + 7] << 0x30;
            auVar109._0_8_ = auVar100._2_8_;
            auVar109._8_8_ = auVar100._8_8_ >> 0x10 | (ulong)(ushort)ptr_06[uVar31 + 7] << 0x30;
            auVar96._0_8_ = auVar95._2_8_;
            auVar96._8_8_ = auVar95._8_8_ >> 0x10 | (ulong)(ushort)ptr_07[uVar31 + 7] << 0x30;
            auVar122._4_4_ = uStack_c4;
            auVar122._0_4_ = local_c8;
            auVar122._8_4_ = uStack_c0;
            auVar122._12_4_ = uStack_bc;
            auVar86 = psubsw(local_58,auVar122);
            auVar121._4_4_ = uStack_d4;
            auVar121._0_4_ = local_d8;
            auVar121._8_4_ = uStack_d0;
            auVar121._12_4_ = uStack_cc;
            auVar100 = psubsw(auVar94,auVar121);
            sVar40 = auVar86._0_2_;
            sVar99 = auVar100._0_2_;
            auVar116._0_2_ = -(ushort)(sVar99 < sVar40);
            sVar44 = auVar86._2_2_;
            sVar102 = auVar100._2_2_;
            auVar116._2_2_ = -(ushort)(sVar102 < sVar44);
            sVar46 = auVar86._4_2_;
            sVar103 = auVar100._4_2_;
            auVar116._4_2_ = -(ushort)(sVar103 < sVar46);
            sVar47 = auVar86._6_2_;
            sVar104 = auVar100._6_2_;
            auVar116._6_2_ = -(ushort)(sVar104 < sVar47);
            sVar48 = auVar86._8_2_;
            sVar105 = auVar100._8_2_;
            auVar116._8_2_ = -(ushort)(sVar105 < sVar48);
            sVar49 = auVar86._10_2_;
            sVar106 = auVar100._10_2_;
            auVar116._10_2_ = -(ushort)(sVar106 < sVar49);
            sVar50 = auVar86._12_2_;
            sVar107 = auVar100._12_2_;
            sVar51 = auVar86._14_2_;
            auVar116._12_2_ = -(ushort)(sVar107 < sVar50);
            sVar108 = auVar100._14_2_;
            auVar116._14_2_ = -(ushort)(sVar108 < sVar51);
            auVar100 = pblendvb(auVar109,local_68,auVar116);
            local_88 = local_118._0_8_;
            uStack_80 = local_118._8_8_;
            auVar95 = pblendvb(auVar96,local_78,auVar116);
            local_118._0_8_ = auVar117._2_8_;
            local_118._8_8_ = auVar117._8_8_ >> 0x10 | (ulong)(ushort)ptr_04[uVar31 + 7] << 0x30;
            auVar115._0_8_ = auVar114._2_8_;
            auVar115._8_8_ = auVar114._8_8_ >> 0x10 | (ulong)(ushort)ptr_08[uVar31 + 7] << 0x30;
            auVar116 = pblendvb(auVar115,local_118,auVar116);
            auVar66 = psubsw(auVar66,auVar122);
            auVar86 = psubsw(local_128,auVar121);
            sVar53 = auVar66._0_2_;
            sVar62 = auVar86._0_2_;
            auVar54._0_2_ = -(ushort)(sVar62 < sVar53);
            sVar55 = auVar66._2_2_;
            sVar70 = auVar86._2_2_;
            auVar54._2_2_ = -(ushort)(sVar70 < sVar55);
            sVar56 = auVar66._4_2_;
            sVar72 = auVar86._4_2_;
            auVar54._4_2_ = -(ushort)(sVar72 < sVar56);
            sVar45 = auVar66._6_2_;
            sVar74 = auVar86._6_2_;
            auVar54._6_2_ = -(ushort)(sVar74 < sVar45);
            sVar52 = auVar66._8_2_;
            sVar76 = auVar86._8_2_;
            auVar54._8_2_ = -(ushort)(sVar76 < sVar52);
            sVar57 = auVar66._10_2_;
            sVar78 = auVar86._10_2_;
            auVar54._10_2_ = -(ushort)(sVar78 < sVar57);
            sVar58 = auVar66._12_2_;
            sVar80 = auVar86._12_2_;
            sVar59 = auVar66._14_2_;
            auVar54._12_2_ = -(ushort)(sVar80 < sVar58);
            sVar82 = auVar86._14_2_;
            auVar54._14_2_ = -(ushort)(sVar82 < sVar59);
            auVar119 = pblendvb(auVar119,auVar111,auVar54);
            uVar63 = *(ushort *)(local_168 + (int)(uVar34 * iVar33) + ptr_00[uVar31 + 2]);
            sVar15 = (short)(local_168 + (int)(uVar35 * iVar33))[ptr_00[uVar31 + 4]];
            sVar22 = (short)(local_168 + (int)(uVar32 * iVar33))[ptr_00[uVar31 + 6]];
            auVar112._10_2_ =
                 (short)local_168[(long)(int)(uVar28 * iVar33) + (long)ptr_00[uVar31 + 5]];
            auVar112._8_2_ = sVar15;
            auVar112._12_2_ = sVar22;
            uVar14 = local_108._2_2_;
            sVar36 = sStack_104;
            sVar4 = sStack_102;
            sVar6 = sStack_100;
            sVar7 = sStack_fe;
            sVar9 = sStack_fc;
            sVar11 = sStack_fa;
            sVar26 = ptr_00[uVar31 + 7];
            _local_108 = stack0xfffffffffffffefa;
            sStack_fa = sVar26;
            auVar120._0_2_ = (ushort)-(ushort)(local_a8._0_2_ == uVar14) >> 0xf;
            auVar120._2_2_ = (ushort)-(ushort)(local_a8._2_2_ == sVar36) >> 0xf;
            auVar120._4_2_ = (ushort)-(ushort)(local_a8._4_2_ == sVar4) >> 0xf;
            auVar120._6_2_ = (ushort)-(ushort)(local_a8._6_2_ == sVar6) >> 0xf;
            auVar120._8_2_ = (ushort)-(ushort)(local_a8._8_2_ == sVar7) >> 0xf;
            auVar120._10_2_ = (ushort)-(ushort)(local_a8._10_2_ == sVar9) >> 0xf;
            auVar120._12_2_ = (ushort)-(ushort)(local_a8._12_2_ == sVar11) >> 0xf;
            auVar120._14_2_ = (ushort)-(ushort)(local_a8._14_2_ == sVar26) >> 0xf;
            auVar114._8_2_ = uStack_1b0;
            auVar114._0_8_ = uVar85;
            auVar114._10_2_ = uStack_1ae;
            auVar114._12_2_ = uStack_1ac;
            auVar114._14_2_ = uStack_1aa;
            auVar121 = paddsw(auVar120,auVar114);
            auVar112._14_2_ = (short)local_168[(long)(int)(uVar17 * iVar33) + (long)sVar26];
            auVar112._0_8_ =
                 (ulong)(uint)local_168[(long)(int)(uVar19 * iVar33) + (long)ptr_00[uVar31]] &
                 0xffffffff0000ffff |
                 (ulong)*(ushort *)
                         (local_168 + (long)(int)(uVar24 * iVar33) + (long)ptr_00[uVar31 + 1]) <<
                 0x10 | (ulong)uVar63 << 0x20 |
                 (ulong)*(ushort *)
                         (local_168 + (long)(int)(uVar18 * iVar33) + (long)ptr_00[uVar31 + 3]) <<
                 0x30;
            auVar66 = paddsw(auVar65,auVar112);
            auVar113._0_2_ =
                 (ushort)-(ushort)(0 < (short)((ulong)(uint)local_168[(long)(int)(uVar19 * iVar33) +
                                                                      (long)ptr_00[uVar31]] &
                                              0xffffffff0000ffff)) >> 0xf;
            auVar113._2_2_ =
                 (ushort)-(ushort)(0 < (short)*(ushort *)
                                               (local_168 +
                                               (long)(int)(uVar24 * iVar33) +
                                               (long)ptr_00[uVar31 + 1])) >> 0xf;
            auVar113._4_2_ = (ushort)-(ushort)(0 < (short)uVar63) >> 0xf;
            auVar113._6_2_ =
                 (ushort)-(ushort)(0 < (short)*(ushort *)
                                               (local_168 +
                                               (long)(int)(uVar18 * iVar33) +
                                               (long)ptr_00[uVar31 + 3])) >> 0xf;
            auVar113._8_2_ = (ushort)-(ushort)(0 < sVar15) >> 0xf;
            auVar113._10_2_ =
                 (ushort)-(ushort)(0 < (short)local_168[(long)(int)(uVar28 * iVar33) +
                                                        (long)ptr_00[uVar31 + 5]]) >> 0xf;
            auVar113._12_2_ = (ushort)-(ushort)(0 < sVar22) >> 0xf;
            auVar113._14_2_ =
                 (ushort)-(ushort)(0 < (short)local_168[(long)(int)(uVar17 * iVar33) + (long)sVar26]
                                  ) >> 0xf;
            auVar114 = paddsw(auVar113,local_1a8);
            local_1b8 = (ushort)(sVar40 < sVar99) * sVar99 | (ushort)(sVar40 >= sVar99) * sVar40;
            uStack_1b6 = (ushort)(sVar44 < sVar102) * sVar102 | (ushort)(sVar44 >= sVar102) * sVar44
            ;
            uStack_1b4 = (ushort)(sVar46 < sVar103) * sVar103 | (ushort)(sVar46 >= sVar103) * sVar46
            ;
            uStack_1b2 = (ushort)(sVar47 < sVar104) * sVar104 | (ushort)(sVar47 >= sVar104) * sVar47
            ;
            uStack_1b0 = (ushort)(sVar48 < sVar105) * sVar105 | (ushort)(sVar48 >= sVar105) * sVar48
            ;
            uStack_1ae = (ushort)(sVar49 < sVar106) * sVar106 | (ushort)(sVar49 >= sVar106) * sVar49
            ;
            uStack_1ac = (ushort)(sVar50 < sVar107) * sVar107 | (ushort)(sVar50 >= sVar107) * sVar50
            ;
            uStack_1aa = (ushort)(sVar51 < sVar108) * sVar108 | (ushort)(sVar51 >= sVar108) * sVar51
            ;
            auVar97._0_2_ = (ushort)(sVar53 < sVar62) * sVar62 | (ushort)(sVar53 >= sVar62) * sVar53
            ;
            auVar97._2_2_ = (ushort)(sVar55 < sVar70) * sVar70 | (ushort)(sVar55 >= sVar70) * sVar55
            ;
            auVar97._4_2_ = (ushort)(sVar56 < sVar72) * sVar72 | (ushort)(sVar56 >= sVar72) * sVar56
            ;
            auVar97._6_2_ = (ushort)(sVar45 < sVar74) * sVar74 | (ushort)(sVar45 >= sVar74) * sVar45
            ;
            auVar97._8_2_ = (ushort)(sVar52 < sVar76) * sVar76 | (ushort)(sVar52 >= sVar76) * sVar52
            ;
            auVar97._10_2_ =
                 (ushort)(sVar57 < sVar78) * sVar78 | (ushort)(sVar57 >= sVar78) * sVar57;
            auVar97._12_2_ =
                 (ushort)(sVar58 < sVar80) * sVar80 | (ushort)(sVar58 >= sVar80) * sVar58;
            auVar97._14_2_ =
                 (ushort)(sVar59 < sVar82) * sVar82 | (ushort)(sVar59 >= sVar82) * sVar59;
            auVar122 = pblendvb(local_138,local_328,auVar54);
            auVar86 = pblendvb(local_308,auVar117,auVar54);
            uVar63 = ((short)auVar97._0_2_ < (short)local_1b8) * local_1b8 |
                     ((short)auVar97._0_2_ >= (short)local_1b8) * auVar97._0_2_;
            uVar71 = ((short)auVar97._2_2_ < (short)uStack_1b6) * uStack_1b6 |
                     ((short)auVar97._2_2_ >= (short)uStack_1b6) * auVar97._2_2_;
            uVar73 = ((short)auVar97._4_2_ < (short)uStack_1b4) * uStack_1b4 |
                     ((short)auVar97._4_2_ >= (short)uStack_1b4) * auVar97._4_2_;
            uVar75 = ((short)auVar97._6_2_ < (short)uStack_1b2) * uStack_1b2 |
                     ((short)auVar97._6_2_ >= (short)uStack_1b2) * auVar97._6_2_;
            uVar77 = ((short)auVar97._8_2_ < (short)uStack_1b0) * uStack_1b0 |
                     ((short)auVar97._8_2_ >= (short)uStack_1b0) * auVar97._8_2_;
            uVar79 = ((short)auVar97._10_2_ < (short)uStack_1ae) * uStack_1ae |
                     ((short)auVar97._10_2_ >= (short)uStack_1ae) * auVar97._10_2_;
            uVar81 = ((short)auVar97._12_2_ < (short)uStack_1ac) * uStack_1ac |
                     ((short)auVar97._12_2_ >= (short)uStack_1ac) * auVar97._12_2_;
            uVar83 = ((short)auVar97._14_2_ < (short)uStack_1aa) * uStack_1aa |
                     ((short)auVar97._14_2_ >= (short)uStack_1aa) * auVar97._14_2_;
            uVar84 = auVar66._0_2_;
            uVar64 = ((short)uVar63 < (short)uVar84) * uVar84 |
                     ((short)uVar63 >= (short)uVar84) * uVar63;
            uVar87 = auVar66._2_2_;
            uVar63 = ((short)uVar71 < (short)uVar87) * uVar87 |
                     ((short)uVar71 >= (short)uVar87) * uVar71;
            uVar88 = auVar66._4_2_;
            uVar71 = ((short)uVar73 < (short)uVar88) * uVar88 |
                     ((short)uVar73 >= (short)uVar88) * uVar73;
            uVar89 = auVar66._6_2_;
            uVar73 = ((short)uVar75 < (short)uVar89) * uVar89 |
                     ((short)uVar75 >= (short)uVar89) * uVar75;
            uVar90 = auVar66._8_2_;
            uVar75 = ((short)uVar77 < (short)uVar90) * uVar90 |
                     ((short)uVar77 >= (short)uVar90) * uVar77;
            uVar91 = auVar66._10_2_;
            uVar77 = ((short)uVar79 < (short)uVar91) * uVar91 |
                     ((short)uVar79 >= (short)uVar91) * uVar79;
            uVar92 = auVar66._12_2_;
            uVar81 = ((short)uVar81 < (short)uVar92) * uVar92 |
                     ((short)uVar81 >= (short)uVar92) * uVar81;
            uVar93 = auVar66._14_2_;
            uVar79 = ((short)uVar83 < (short)uVar93) * uVar93 |
                     ((short)uVar83 >= (short)uVar93) * uVar83;
            auVar66 = pmovsxbw(auVar111,0x101010101010101);
            auVar118._0_2_ = -(ushort)((short)uVar64 < auVar66._0_2_);
            auVar118._2_2_ = -(ushort)((short)uVar63 < auVar66._2_2_);
            auVar118._4_2_ = -(ushort)((short)uVar71 < auVar66._4_2_);
            auVar118._6_2_ = -(ushort)((short)uVar73 < auVar66._6_2_);
            auVar118._8_2_ = -(ushort)((short)uVar75 < auVar66._8_2_);
            auVar118._10_2_ = -(ushort)((short)uVar77 < auVar66._10_2_);
            auVar118._12_2_ = -(ushort)((short)uVar81 < auVar66._12_2_);
            auVar118._14_2_ = -(ushort)((short)uVar79 < auVar66._14_2_);
            uVar64 = (-1 < (short)uVar64) * uVar64;
            uVar63 = (-1 < (short)uVar63) * uVar63;
            auVar68._2_2_ = uVar63;
            auVar68._0_2_ = uVar64;
            uVar71 = (-1 < (short)uVar71) * uVar71;
            auVar68._4_2_ = uVar71;
            uVar73 = (-1 < (short)uVar73) * uVar73;
            auVar68._6_2_ = uVar73;
            uVar75 = (-1 < (short)uVar75) * uVar75;
            auVar68._8_2_ = uVar75;
            uVar77 = (-1 < (short)uVar77) * uVar77;
            auVar68._10_2_ = uVar77;
            uVar81 = (-1 < (short)uVar81) * uVar81;
            auVar68._12_2_ = uVar81;
            uVar79 = (-1 < (short)uVar79) * uVar79;
            auVar68._14_2_ = uVar79;
            auVar60._0_2_ = -(ushort)(uVar84 == uVar64);
            auVar60._2_2_ = -(ushort)(uVar87 == uVar63);
            auVar60._4_2_ = -(ushort)(uVar88 == uVar71);
            auVar60._6_2_ = -(ushort)(uVar89 == uVar73);
            auVar60._8_2_ = -(ushort)(uVar90 == uVar75);
            auVar60._10_2_ = -(ushort)(uVar91 == uVar77);
            auVar60._12_2_ = -(ushort)(uVar92 == uVar81);
            auVar60._14_2_ = -(ushort)(uVar93 == uVar79);
            auVar117._0_2_ = -(ushort)(uVar64 == local_1b8);
            auVar117._2_2_ = -(ushort)(uVar63 == uStack_1b6);
            auVar117._4_2_ = -(ushort)(uVar71 == uStack_1b4);
            auVar117._6_2_ = -(ushort)(uVar73 == uStack_1b2);
            auVar117._8_2_ = -(ushort)(uVar75 == uStack_1b0);
            auVar117._10_2_ = -(ushort)(uVar77 == uStack_1ae);
            auVar117._12_2_ = -(ushort)(uVar81 == uStack_1ac);
            auVar117._14_2_ = -(ushort)(uVar79 == uStack_1aa);
            local_1a8 = auVar100;
            auVar65 = pblendvb(auVar119,auVar100,auVar117);
            auVar111 = pblendvb(auVar65,auVar121,auVar60);
            auVar65 = pblendvb(auVar122,auVar95,auVar117);
            local_328 = pblendvb(auVar65,auVar114,auVar60);
            auVar114 = paddsw(auVar116,auVar66);
            local_308 = paddsw(auVar86,auVar66);
            auVar65 = pblendvb(local_308,auVar114,auVar117);
            auVar66 = paddsw(auVar98,auVar66);
            auVar117 = pblendvb(auVar65,auVar66,auVar60);
            sVar46 = auVar67._0_2_;
            auVar61._0_2_ = -(ushort)(sVar46 == -1);
            sVar47 = auVar67._2_2_;
            auVar61._2_2_ = -(ushort)(sVar47 == -1);
            sVar48 = auVar67._4_2_;
            auVar61._4_2_ = -(ushort)(sVar48 == -1);
            sVar49 = auVar67._6_2_;
            auVar61._6_2_ = -(ushort)(sVar49 == -1);
            sVar50 = auVar67._8_2_;
            auVar61._8_2_ = -(ushort)(sVar50 == -1);
            sVar51 = auVar67._10_2_;
            auVar61._10_2_ = -(ushort)(sVar51 == -1);
            sVar53 = auVar67._12_2_;
            sVar55 = auVar67._14_2_;
            auVar61._12_2_ = -(ushort)(sVar53 == -1);
            auVar61._14_2_ = -(ushort)(sVar55 == -1);
            auVar118 = auVar118 | auVar61;
            auVar111 = ~auVar118 & auVar111;
            local_328 = ~auVar118 & local_328;
            auVar98._4_2_ = local_2d8;
            auVar98._0_4_ = uVar41;
            auVar98._6_2_ = sStack_2d6;
            auVar98._8_2_ = local_2d8;
            auVar98._10_2_ = sStack_2d6;
            auVar98._12_2_ = local_2d8;
            auVar98._14_2_ = sStack_2d6;
            local_128 = pblendvb(auVar97,auVar98,auVar61);
            auVar117 = ~auVar118 & auVar117;
            auVar66 = ~auVar61 & auVar68;
            sVar26 = auVar66._0_2_;
            sVar36 = auVar66._2_2_;
            sVar40 = auVar66._14_2_;
            sVar4 = auVar66._4_2_;
            sVar6 = auVar66._6_2_;
            sVar7 = auVar66._8_2_;
            sVar9 = auVar66._10_2_;
            sVar11 = auVar66._12_2_;
            sVar15 = auVar111._0_2_;
            sVar22 = auVar117._0_2_;
            sVar44 = local_328._0_2_;
            if (7 < uVar31) {
              bVar2 = sVar26 < (short)local_268;
              uVar63 = (ushort)!bVar2 * (short)local_268;
              bVar3 = sVar36 < local_268._2_2_;
              uVar77 = (ushort)!bVar3 * local_268._2_2_;
              bVar5 = sVar4 < local_268._4_2_;
              uVar75 = (ushort)!bVar5 * local_268._4_2_;
              bVar8 = sVar7 < (short)uStack_260;
              uVar73 = (ushort)!bVar8 * (short)uStack_260;
              bVar10 = sVar9 < uStack_260._2_2_;
              uVar71 = (ushort)!bVar10 * uStack_260._2_2_;
              bVar12 = sVar11 < uStack_260._4_2_;
              uVar64 = (ushort)!bVar12 * uStack_260._4_2_;
              local_268 = CONCAT26((ushort)(sVar6 < local_268._6_2_) * sVar6 |
                                   (ushort)(sVar6 >= local_268._6_2_) * local_268._6_2_,
                                   CONCAT24((ushort)bVar5 * sVar4 | uVar75,
                                            CONCAT22((ushort)bVar3 * sVar36 | uVar77,
                                                     (ushort)bVar2 * sVar26 | uVar63)));
              uStack_260 = CONCAT26((ushort)(sVar40 < uStack_260._6_2_) * sVar40 |
                                    (ushort)(sVar40 >= uStack_260._6_2_) * uStack_260._6_2_,
                                    CONCAT24((ushort)bVar12 * sVar11 | uVar64,
                                             CONCAT22((ushort)bVar10 * sVar9 | uVar71,
                                                      (ushort)bVar8 * sVar7 | uVar73)));
              uVar63 = (ushort)((short)local_258._0_2_ < sVar26) * sVar26 |
                       (ushort)((short)local_258._0_2_ >= sVar26) * local_258._0_2_;
              uVar64 = (ushort)((short)local_258._2_2_ < sVar36) * sVar36 |
                       (ushort)((short)local_258._2_2_ >= sVar36) * local_258._2_2_;
              uVar71 = (ushort)((short)local_258._4_2_ < sVar4) * sVar4 |
                       (ushort)((short)local_258._4_2_ >= sVar4) * local_258._4_2_;
              uVar73 = (ushort)((short)local_258._6_2_ < sVar6) * sVar6 |
                       (ushort)((short)local_258._6_2_ >= sVar6) * local_258._6_2_;
              uVar75 = (ushort)((short)local_258._8_2_ < sVar7) * sVar7 |
                       (ushort)((short)local_258._8_2_ >= sVar7) * local_258._8_2_;
              uVar77 = (ushort)((short)local_258._10_2_ < sVar9) * sVar9 |
                       (ushort)((short)local_258._10_2_ >= sVar9) * local_258._10_2_;
              uVar79 = (ushort)((short)local_258._12_2_ < sVar11) * sVar11 |
                       (ushort)((short)local_258._12_2_ >= sVar11) * local_258._12_2_;
              uVar81 = (ushort)((short)local_258._14_2_ < sVar40) * sVar40 |
                       (ushort)((short)local_258._14_2_ >= sVar40) * local_258._14_2_;
              uVar84 = (ushort)((short)uVar63 < sVar15) * sVar15 |
                       ((short)uVar63 >= sVar15) * uVar63;
              sVar56 = auVar111._2_2_;
              uVar87 = (ushort)((short)uVar64 < sVar56) * sVar56 |
                       ((short)uVar64 >= sVar56) * uVar64;
              sVar56 = auVar111._4_2_;
              uVar88 = (ushort)((short)uVar71 < sVar56) * sVar56 |
                       ((short)uVar71 >= sVar56) * uVar71;
              sVar56 = auVar111._6_2_;
              uVar89 = (ushort)((short)uVar73 < sVar56) * sVar56 |
                       ((short)uVar73 >= sVar56) * uVar73;
              sVar56 = auVar111._8_2_;
              uVar90 = (ushort)((short)uVar75 < sVar56) * sVar56 |
                       ((short)uVar75 >= sVar56) * uVar75;
              sVar56 = auVar111._10_2_;
              uVar91 = (ushort)((short)uVar77 < sVar56) * sVar56 |
                       ((short)uVar77 >= sVar56) * uVar77;
              sVar56 = auVar111._12_2_;
              uVar92 = (ushort)((short)uVar79 < sVar56) * sVar56 |
                       ((short)uVar79 >= sVar56) * uVar79;
              sVar56 = auVar111._14_2_;
              uVar93 = (ushort)((short)uVar81 < sVar56) * sVar56 |
                       ((short)uVar81 >= sVar56) * uVar81;
              uVar63 = (ushort)(sVar44 < sVar22) * sVar22 | (ushort)(sVar44 >= sVar22) * sVar44;
              sVar56 = auVar117._2_2_;
              sVar45 = local_328._2_2_;
              uVar64 = (ushort)(sVar45 < sVar56) * sVar56 | (ushort)(sVar45 >= sVar56) * sVar45;
              sVar56 = auVar117._4_2_;
              sVar45 = local_328._4_2_;
              uVar71 = (ushort)(sVar45 < sVar56) * sVar56 | (ushort)(sVar45 >= sVar56) * sVar45;
              sVar56 = auVar117._6_2_;
              sVar45 = local_328._6_2_;
              uVar73 = (ushort)(sVar45 < sVar56) * sVar56 | (ushort)(sVar45 >= sVar56) * sVar45;
              sVar56 = auVar117._8_2_;
              sVar45 = local_328._8_2_;
              uVar75 = (ushort)(sVar45 < sVar56) * sVar56 | (ushort)(sVar45 >= sVar56) * sVar45;
              sVar56 = auVar117._10_2_;
              sVar45 = local_328._10_2_;
              uVar77 = (ushort)(sVar45 < sVar56) * sVar56 | (ushort)(sVar45 >= sVar56) * sVar45;
              sVar56 = auVar117._12_2_;
              sVar45 = local_328._12_2_;
              sVar52 = local_328._14_2_;
              uVar79 = (ushort)(sVar45 < sVar56) * sVar56 | (ushort)(sVar45 >= sVar56) * sVar45;
              sVar56 = auVar117._14_2_;
              uVar81 = (ushort)(sVar52 < sVar56) * sVar56 | (ushort)(sVar52 >= sVar56) * sVar52;
              local_258._2_2_ =
                   ((short)uVar87 < (short)uVar64) * uVar64 |
                   ((short)uVar87 >= (short)uVar64) * uVar87;
              local_258._0_2_ =
                   ((short)uVar84 < (short)uVar63) * uVar63 |
                   ((short)uVar84 >= (short)uVar63) * uVar84;
              local_258._4_2_ =
                   ((short)uVar88 < (short)uVar71) * uVar71 |
                   ((short)uVar88 >= (short)uVar71) * uVar88;
              local_258._6_2_ =
                   ((short)uVar89 < (short)uVar73) * uVar73 |
                   ((short)uVar89 >= (short)uVar73) * uVar89;
              local_258._8_2_ =
                   ((short)uVar90 < (short)uVar75) * uVar75 |
                   ((short)uVar90 >= (short)uVar75) * uVar90;
              local_258._10_2_ =
                   ((short)uVar91 < (short)uVar77) * uVar77 |
                   ((short)uVar91 >= (short)uVar77) * uVar91;
              local_258._12_2_ =
                   ((short)uVar92 < (short)uVar79) * uVar79 |
                   ((short)uVar92 >= (short)uVar79) * uVar92;
              local_258._14_2_ =
                   ((short)uVar93 < (short)uVar81) * uVar81 |
                   ((short)uVar93 >= (short)uVar81) * uVar93;
            }
            ptr_01[uVar31] = sVar26;
            auVar43._0_2_ = -(ushort)(sVar46 < (short)local_e8);
            auVar43._2_2_ = -(ushort)(sVar47 < local_e8._2_2_);
            auVar43._4_2_ = -(ushort)(sVar48 < (short)uStack_e4);
            auVar43._6_2_ = -(ushort)(sVar49 < uStack_e4._2_2_);
            auVar43._8_2_ = -(ushort)(sVar50 < (short)uStack_e0);
            auVar43._10_2_ = -(ushort)(sVar51 < uStack_e0._2_2_);
            auVar43._12_2_ = -(ushort)(sVar53 < (short)uStack_dc);
            auVar43._14_2_ = -(ushort)(sVar55 < uStack_dc._2_2_);
            auVar13._2_2_ = -(ushort)((short)local_248._2_2_ < local_f8._2_2_);
            auVar13._0_2_ = -(ushort)((short)local_248._0_2_ < (short)local_f8);
            auVar13._4_2_ = -(ushort)((short)local_248._4_2_ < (short)uStack_f4);
            auVar13._6_2_ = -(ushort)((short)local_248._6_2_ < uStack_f4._2_2_);
            auVar13._8_2_ = -(ushort)((short)local_248._8_2_ < (short)uStack_f0);
            auVar13._10_2_ = -(ushort)((short)local_248._10_2_ < uStack_f0._2_2_);
            auVar13._12_2_ = -(ushort)((short)local_248._12_2_ < (short)uStack_ec);
            auVar13._14_2_ = -(ushort)((short)local_248._14_2_ < uStack_ec._2_2_);
            auVar65 = psraw(auVar67,0xf);
            auVar98 = ~auVar65 & auVar43 & auVar13;
            auVar110._0_2_ = -(ushort)(sVar26 == local_188._0_2_);
            auVar110._2_2_ = -(ushort)(sVar36 == local_188._2_2_);
            auVar110._4_2_ = -(ushort)(sVar4 == local_188._4_2_);
            auVar110._6_2_ = -(ushort)(sVar6 == local_188._6_2_);
            auVar110._8_2_ = -(ushort)(sVar7 == local_188._8_2_);
            auVar110._10_2_ = -(ushort)(sVar9 == local_188._10_2_);
            auVar110._12_2_ = -(ushort)(sVar11 == local_188._12_2_);
            auVar110._14_2_ = -(ushort)(sVar40 == local_188._14_2_);
            auVar101._0_2_ = -(ushort)(local_188._0_2_ < sVar26);
            auVar101._2_2_ = -(ushort)(local_188._2_2_ < sVar36);
            auVar101._4_2_ = -(ushort)(local_188._4_2_ < sVar4);
            auVar101._6_2_ = -(ushort)(local_188._6_2_ < sVar6);
            auVar101._8_2_ = -(ushort)(local_188._8_2_ < sVar7);
            auVar101._10_2_ = -(ushort)(local_188._10_2_ < sVar9);
            auVar101._12_2_ = -(ushort)(local_188._12_2_ < sVar11);
            auVar101._14_2_ = -(ushort)(local_188._14_2_ < sVar40);
            local_188 = pblendvb(local_188,auVar68,auVar101 & auVar98);
            auVar121 = local_188;
            auVar69._0_2_ = -(ushort)(sVar46 < local_198._0_2_);
            auVar69._2_2_ = -(ushort)(sVar47 < local_198._2_2_);
            auVar69._4_2_ = -(ushort)(sVar48 < local_198._4_2_);
            auVar69._6_2_ = -(ushort)(sVar49 < local_198._6_2_);
            auVar69._8_2_ = -(ushort)(sVar50 < local_198._8_2_);
            auVar69._10_2_ = -(ushort)(sVar51 < local_198._10_2_);
            auVar69._12_2_ = -(ushort)(sVar53 < local_198._12_2_);
            auVar69._14_2_ = -(ushort)(sVar55 < local_198._14_2_);
            auVar65 = pblendvb(auVar101 & auVar98,auVar98,auVar69 & auVar110);
            local_2c8 = pblendvb(local_2c8,auVar111,auVar65);
            local_2b8 = pblendvb(local_2b8,local_328,auVar65);
            local_2a8 = pblendvb(local_2a8,auVar117,auVar65);
            ptr_02[uVar31] = sVar15;
            auVar119 = ~auVar61 & auVar119;
            local_218 = pblendvb(local_218,local_248,auVar65);
            ptr_03[uVar31] = sVar44;
            ptr_04[uVar31] = sVar22;
            local_308 = ~auVar61 & local_308;
            auVar86._2_2_ = uStack_1b6;
            auVar86._0_2_ = local_1b8;
            auVar86._4_2_ = uStack_1b4;
            auVar86._6_2_ = uStack_1b2;
            auVar86._8_2_ = uStack_1b0;
            auVar86._10_2_ = uStack_1ae;
            auVar86._12_2_ = uStack_1ac;
            auVar86._14_2_ = uStack_1aa;
            ptr_05[uVar31] = local_1b8;
            ptr_06[uVar31] = auVar100._0_2_;
            ptr_07[uVar31] = auVar95._0_2_;
            ptr_08[uVar31] = auVar114._0_2_;
            local_198 = pblendvb(local_198,auVar67,(auVar69 & auVar110 | auVar101) & auVar98);
            auVar98 = local_198;
            auVar65 = pmovsxbw(local_198,0x101010101010101);
            auVar67 = paddsw(auVar67,auVar65);
            uVar31 = uVar31 + 1;
            local_138 = ~auVar61 & auVar122;
            auVar65 = local_58;
            auVar100 = local_1a8;
            uVar85 = local_68._0_8_;
          } while (local_158 != uVar31);
          local_248 = paddsw(local_248,_DAT_00904d20);
          uVar39 = uVar39 + 8;
        } while ((long)uVar39 < lVar21);
        local_178 = local_188._0_8_;
        uStack_170 = local_188._8_8_;
        local_228 = local_198._0_8_;
        uStack_220 = local_198._8_8_;
        local_198 = auVar98;
        local_188 = auVar121;
        local_a8 = auVar42;
      }
      local_1e8 = local_2c8;
      local_1f8 = local_2b8;
      local_208 = local_2a8;
      lVar21 = 0;
      iVar33 = 0;
      iVar23 = 0;
      uVar38 = uVar27;
      uVar17 = uVar27;
      uVar19 = uVar27;
      do {
        uVar63 = *(ushort *)((long)&local_178 + lVar21 * 2);
        if ((short)(ushort)uVar27 < (short)uVar63) {
          uVar38 = (uint)*(ushort *)(local_1e8 + lVar21 * 2);
          uVar19 = (uint)*(ushort *)(local_1f8 + lVar21 * 2);
          uVar17 = (uint)*(ushort *)(local_208 + lVar21 * 2);
          uVar27 = (uint)uVar63;
          iVar33 = (int)*(short *)(local_218 + lVar21 * 2);
          iVar23 = (int)*(short *)((long)&local_228 + lVar21 * 2);
        }
        else if (uVar63 == (ushort)uVar27) {
          iVar16 = (int)*(short *)((long)&local_228 + lVar21 * 2);
          if (iVar16 < iVar23) {
            uVar38 = (uint)*(ushort *)(local_1e8 + lVar21 * 2);
            uVar19 = (uint)*(ushort *)(local_1f8 + lVar21 * 2);
            uVar17 = (uint)*(ushort *)(local_208 + lVar21 * 2);
            iVar33 = (int)*(short *)(local_218 + lVar21 * 2);
            iVar23 = iVar16;
          }
          else if ((iVar23 == iVar16) && (*(short *)(local_218 + lVar21 * 2) < iVar33)) {
            uVar38 = (uint)*(ushort *)(local_1e8 + lVar21 * 2);
            uVar19 = (uint)*(ushort *)(local_1f8 + lVar21 * 2);
            uVar17 = (uint)*(ushort *)(local_208 + lVar21 * 2);
            iVar33 = (int)*(short *)(local_218 + lVar21 * 2);
          }
        }
        sVar22 = (short)uVar17;
        sVar15 = (short)uVar19;
        sVar26 = (short)uVar38;
        sVar36 = (short)uVar27;
        lVar21 = lVar21 + 1;
      } while ((int)lVar21 != 8);
      auVar95._0_2_ = -(ushort)((short)local_268 < local_2d8);
      auVar95._2_2_ = -(ushort)(local_268._2_2_ < sStack_2d6);
      auVar95._4_2_ = -(ushort)(local_268._4_2_ < local_2d8);
      auVar95._6_2_ = -(ushort)(local_268._6_2_ < sStack_2d6);
      auVar95._8_2_ = -(ushort)((short)uStack_260 < local_2d8);
      auVar95._10_2_ = -(ushort)(uStack_260._2_2_ < sStack_2d6);
      auVar95._12_2_ = -(ushort)(uStack_260._4_2_ < local_2d8);
      auVar95._14_2_ = -(ushort)(uStack_260._6_2_ < sStack_2d6);
      auVar111._0_2_ = -(ushort)(local_1d8 < (short)local_258._0_2_);
      auVar111._2_2_ = -(ushort)(sStack_1d6 < (short)local_258._2_2_);
      auVar111._4_2_ = -(ushort)(sStack_1d4 < (short)local_258._4_2_);
      auVar111._6_2_ = -(ushort)(sStack_1d2 < (short)local_258._6_2_);
      auVar111._8_2_ = -(ushort)(sStack_1d0 < (short)local_258._8_2_);
      auVar111._10_2_ = -(ushort)(sStack_1ce < (short)local_258._10_2_);
      auVar111._12_2_ = -(ushort)(sStack_1cc < (short)local_258._12_2_);
      auVar111._14_2_ = -(ushort)(sStack_1ca < (short)local_258._14_2_);
      auVar111 = auVar111 | auVar95;
      if ((((((((((((((((auVar111 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar111 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar111 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar111 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar111 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar111 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar111 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar111 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar111 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar111 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar111 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar111 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar111[0xf] < '\0') {
        *(byte *)&ppVar20->flag = (byte)ppVar20->flag | 0x40;
        sVar15 = 0;
        sVar22 = 0;
        sVar26 = 0;
        sVar36 = 0;
        iVar23 = 0;
        iVar33 = 0;
      }
      ppVar20->score = (int)sVar36;
      ppVar20->end_query = iVar33;
      ppVar20->end_ref = iVar23;
      *(int *)(ppVar20->field_4).extra = (int)sVar26;
      ((ppVar20->field_4).stats)->similar = (int)sVar15;
      ((ppVar20->field_4).stats)->length = (int)sVar22;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar20;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _HM_pr = NULL;
    int16_t * restrict _HS_pr = NULL;
    int16_t * restrict _HL_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict _FM_pr = NULL;
    int16_t * restrict _FS_pr = NULL;
    int16_t * restrict _FL_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict HM_pr = NULL;
    int16_t * restrict HS_pr = NULL;
    int16_t * restrict HL_pr = NULL;
    int16_t * restrict F_pr = NULL;
    int16_t * restrict FM_pr = NULL;
    int16_t * restrict FS_pr = NULL;
    int16_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vJLimit = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int16_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i case0 = vZero;
        __m128i vNH = vNegInf0;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vNegInf0;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi16(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3],
                s1[i+4],
                s1[i+5],
                s1[i+6],
                s1[i+7]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vNM = _mm_srli_si128(vWM, 2);
            vNM = _mm_insert_epi16(vNM, HM_pr[j], 7);
            vNS = _mm_srli_si128(vWS, 2);
            vNS = _mm_insert_epi16(vNS, HS_pr[j], 7);
            vNL = _mm_srli_si128(vWL, 2);
            vNL = _mm_insert_epi16(vNL, HL_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vFM = _mm_srli_si128(vFM, 2);
            vFM = _mm_insert_epi16(vFM, FM_pr[j], 7);
            vFS = _mm_srli_si128(vFS, 2);
            vFS = _mm_insert_epi16(vFS, FS_pr[j], 7);
            vFL = _mm_srli_si128(vFL, 2);
            vFL = _mm_insert_epi16(vFL, FL_pr[j], 7);
            vF_opn = _mm_subs_epi16(vNH, vOpen);
            vF_ext = _mm_subs_epi16(vF, vGap);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vE_opn = _mm_subs_epi16(vWH, vOpen);
            vE_ext = _mm_subs_epi16(vE, vGap);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 2);
            vs2 = _mm_insert_epi16(vs2, s2[j], 7);
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            vWH = _mm_max_epi16(vWH, vZero);
            case1 = _mm_cmpeq_epi16(vWH, vNWH);
            case2 = _mm_cmpeq_epi16(vWH, vF);
            case0 = _mm_cmpeq_epi16(vWH, vZero);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi16(vs1,vs2),
                            vOne)),
                    case1);
            vWM = _mm_blendv_epi8(vWM, vZero, case0);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi16(vMat,vZero),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(vWS, vZero, case0);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vNWL, vOne), case1);
            vWL = _mm_blendv_epi8(vWL, vZero, case0);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            HM_pr[j-7] = (int16_t)_mm_extract_epi16(vWM,0);
            HS_pr[j-7] = (int16_t)_mm_extract_epi16(vWS,0);
            HL_pr[j-7] = (int16_t)_mm_extract_epi16(vWL,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            FM_pr[j-7] = (int16_t)_mm_extract_epi16(vFM,0);
            FS_pr[j-7] = (int16_t)_mm_extract_epi16(vFS,0);
            FL_pr[j-7] = (int16_t)_mm_extract_epi16(vFL,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi16(vJ, vNegOne),
                        _mm_cmplt_epi16(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi16(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi16(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi16(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *m = (int16_t*)&vMaxM;
        int16_t *s = (int16_t*)&vMaxS;
        int16_t *l = (int16_t*)&vMaxL;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++m, ++s, ++l, ++i, ++j) {
            if (*t > score) {
                score = *t;
                matches = *m;
                similar = *s;
                length = *l;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}